

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int set_directory_record
              (uchar *p,size_t n,isoent *isoent,iso9660_conflict *iso9660,dir_rec_type t,
              vdd_type vdd_type)

{
  bool bVar1;
  mode_t mVar2;
  uint uVar3;
  wchar_t wVar4;
  time_t tVar5;
  uchar *puVar6;
  la_int64_t lVar7;
  la_int64_t lVar8;
  content_conflict *pcVar9;
  uint32_t *puVar10;
  time_t tVar11;
  dev_t dVar12;
  uchar uVar13;
  long lVar14;
  byte *pbVar15;
  byte *pbVar16;
  bool bVar17;
  int iVar18;
  isofile *piVar19;
  byte *pbVar20;
  uchar uVar21;
  byte bVar22;
  uint32_t value;
  int iVar23;
  byte *pbVar24;
  byte bVar25;
  isoent *piVar26;
  byte bVar27;
  size_t sVar28;
  size_t __n;
  uchar *puVar29;
  ulong uVar30;
  char *__src;
  byte local_b1;
  isofile *local_b0;
  isoent *local_a8;
  ctl_extr_rec ctl;
  isoent *local_68;
  isoent *local_58;
  isoent *local_50;
  
  if (p != (uchar *)0x0) {
    lVar14 = 0x98;
    if (t < DIR_REC_NORMAL) {
      lVar14 = (ulong)t * 4 + 0x8c;
    }
    if (n < (ulong)(long)*(int *)((long)(isoent->rbnode).rb_nodes + lVar14)) {
      return 0;
    }
  }
  sVar28 = 1;
  if ((t == DIR_REC_NORMAL) && (isoent->identifier != (char *)0x0)) {
    sVar28 = (size_t)isoent->id_len;
  }
  local_a8 = isoent;
  if (p == (uchar *)0x0) {
    puVar29 = (uchar *)0x0;
  }
  else {
    local_b0 = (isofile *)CONCAT44(local_b0._4_4_,vdd_type);
    piVar26 = isoent;
    if (t == DIR_REC_PARENT) {
      piVar26 = isoent->parent;
    }
    piVar19 = isoent->file->hardlink_target;
    if (piVar19 == (isofile *)0x0) {
      piVar19 = isoent->file;
    }
    uVar21 = '\x02';
    if ((piVar26->field_0xe8 & 2) == 0) {
      uVar21 = (piVar19->cur_content->next != (content_conflict *)0x0) << 7;
    }
    p[1] = '\0';
    if ((piVar26->field_0xe8 & 2) == 0) {
      puVar10 = &piVar19->cur_content->location;
    }
    else {
      puVar10 = &piVar26->dir_location;
    }
    set_num_733(p + 2,*puVar10);
    if ((piVar26->field_0xe8 & 2) == 0) {
      value = (uint32_t)piVar19->cur_content->size;
    }
    else {
      value = piVar26->dir_block << 0xb;
    }
    puVar29 = p + -1;
    set_num_733(p + 10,value);
    tVar5 = archive_entry_mtime(piVar26->file->entry);
    set_time_915(p + 0x12,tVar5);
    isoent = local_a8;
    p[0x19] = uVar21;
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    iVar18 = iso9660->volume_sequence_number;
    uVar21 = (uchar)iVar18;
    p[0x1c] = uVar21;
    uVar13 = (uchar)((uint)iVar18 >> 8);
    p[0x1d] = uVar13;
    p[0x1e] = uVar13;
    p[0x1f] = uVar21;
    p[0x20] = (uchar)sVar28;
    vdd_type = (vdd_type)local_b0;
    if (t < DIR_REC_PARENT) {
      p[0x21] = '\0';
    }
    else if (t == DIR_REC_PARENT) {
      p[0x21] = '\x01';
    }
    else if (local_a8->identifier == (char *)0x0) {
      p[0x21] = '\0';
    }
    else {
      memcpy(p + 0x21,local_a8->identifier,sVar28);
    }
  }
  uVar30 = sVar28 + 0x21;
  if ((uVar30 & 1) == 0) {
    if (t == DIR_REC_VD) {
      if (p == (uchar *)0x0) {
LAB_0036d470:
        (isoent->dr_len).vd = (int)uVar30;
        return (int)uVar30;
      }
      goto LAB_0036de4a;
    }
  }
  else {
    uVar30 = sVar28 + 0x22;
    if (p == (uchar *)0x0) {
      if (t == DIR_REC_VD) goto LAB_0036d470;
    }
    else {
      puVar29[uVar30] = '\0';
      if (t == DIR_REC_VD) goto LAB_0036de4a;
    }
  }
  iVar18 = (int)uVar30;
  if ((vdd_type != VDD_JOLIET) && (((uint)iso9660->opt & 0x1800000) != 0)) {
    puVar6 = puVar29 + iVar18;
    if (puVar29 == (uchar *)0x0) {
      puVar6 = (uchar *)0x0;
    }
    ctl.use_extr = 0;
    ctl.ce_ptr = (uchar *)0x0;
    ctl.limit = 0xe2;
    ctl.bp = puVar29;
    ctl.isoent = isoent;
    ctl.cur_len = iVar18;
    ctl.dr_len = iVar18;
    if (t == DIR_REC_PARENT) {
      local_58 = isoent->parent;
      local_50 = isoent->rr_parent;
      local_68 = local_50;
      if (local_50 == (isoent *)0x0) {
        local_68 = local_58;
      }
      piVar19 = local_68->file;
      bVar22 = (local_50 != (isoent *)0x0) << 5 | 0x81;
      iVar23 = 0xe2;
      bVar1 = false;
    }
    else {
      piVar19 = isoent->file;
      bVar22 = 0x81;
      iVar23 = 0xe2;
      if (t == DIR_REC_SELF) {
        bVar1 = true;
        if (local_a8->parent == local_a8) {
          if (puVar6 == (uchar *)0x0) {
            puVar6 = (uchar *)0x0;
          }
          else {
            puVar6[1] = 'S';
            puVar6[2] = 'P';
            puVar6[3] = '\a';
            puVar6[4] = '\x01';
            puVar6[5] = 0xbe;
            puVar6[6] = 0xef;
            puVar6[7] = '\0';
            puVar6 = puVar6 + 7;
          }
          extra_tell_used_size(&ctl,7);
          iVar23 = ctl.limit;
          iVar18 = ctl.cur_len;
        }
      }
      else {
        if (t == DIR_REC_NORMAL) {
          mVar2 = archive_entry_filetype(piVar19->entry);
          bVar27 = (local_a8->rr_child != (isoent *)0x0) << 4 |
                   (local_a8->rr_parent != (isoent *)0x0) << 6 | (mVar2 == 0xa000) << 2;
          bVar22 = bVar27 | 0x89;
          mVar2 = archive_entry_filetype(piVar19->entry);
          if ((mVar2 == 0x2000) || (mVar2 = archive_entry_filetype(piVar19->entry), mVar2 == 0x6000)
             ) {
            bVar22 = bVar27 | 0x8b;
          }
        }
        bVar1 = false;
      }
      local_50 = (isoent *)0x0;
      local_58 = local_a8;
      local_68 = local_a8;
    }
    if (iVar23 - iVar18 < 5) {
      puVar6 = extra_next_record(&ctl,5);
    }
    if (puVar6 == (uchar *)0x0) {
      puVar6 = (uchar *)0x0;
    }
    else {
      puVar6[1] = 'R';
      puVar6[2] = 'R';
      puVar6[3] = '\x05';
      puVar6[4] = '\x01';
      puVar6[5] = bVar22;
      puVar6 = puVar6 + 5;
    }
    extra_tell_used_size(&ctl,5);
    local_b0 = piVar19;
    if ((bVar22 & 8) != 0) {
      __src = (piVar19->basename).s;
      __n = (piVar19->basename).length;
      if (ctl.limit - ctl.cur_len < 6) {
        puVar6 = extra_next_record(&ctl,6);
      }
      if (puVar6 != (uchar *)0x0) {
        puVar6[1] = 'N';
        puVar6[2] = 'M';
        puVar6[4] = '\x01';
      }
      uVar30 = (ulong)(uint)(ctl.limit - ctl.cur_len);
      if (0xfe < (uint)(ctl.limit - ctl.cur_len)) {
        uVar30 = 0xff;
      }
      while (uVar30 < __n + 5) {
        if (puVar6 == (uchar *)0x0) {
          sVar28 = (long)((uVar30 << 0x20) + -0x500000000) >> 0x20;
          puVar6 = (uchar *)0x0;
        }
        else {
          puVar6[3] = (uchar)uVar30;
          puVar6[5] = '\x01';
          sVar28 = (long)((uVar30 << 0x20) + -0x500000000) >> 0x20;
          memcpy(puVar6 + 6,__src,sVar28);
          puVar6 = puVar6 + uVar30;
        }
        extra_tell_used_size(&ctl,(int)uVar30);
        if (ctl.limit - ctl.cur_len < 6) {
          puVar6 = extra_next_record(&ctl,6);
          uVar30 = (ulong)(uint)(ctl.limit - ctl.cur_len);
          if (0xfe < (uint)(ctl.limit - ctl.cur_len)) {
            uVar30 = 0xff;
          }
        }
        __n = __n - sVar28;
        __src = __src + sVar28;
        if (puVar6 != (uchar *)0x0) {
          puVar6[1] = 'N';
          puVar6[2] = 'M';
          puVar6[4] = '\x01';
        }
      }
      iVar18 = (int)__n + 5;
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        puVar6[3] = (uchar)iVar18;
        puVar6[5] = '\0';
        memcpy(puVar6 + 6,__src,__n);
        puVar6 = puVar6 + iVar18;
      }
      piVar19 = local_b0;
      extra_tell_used_size(&ctl,iVar18);
    }
    if ((bVar22 & 1) != 0) {
      if (ctl.limit - ctl.cur_len < 0x2c) {
        puVar6 = extra_next_record(&ctl,0x2c);
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        mVar2 = archive_entry_mode(piVar19->entry);
        lVar7 = archive_entry_uid(piVar19->entry);
        lVar8 = archive_entry_gid(piVar19->entry);
        if (((uint)iso9660->opt & 0x1800000) == 0x1000000) {
          uVar3 = 0x16d;
          if ((mVar2 & 0x49) == 0) {
            uVar3 = 0x124;
          }
          mVar2 = mVar2 & 0xfffff049 | uVar3;
        }
        builtin_memcpy(puVar6 + 1,"PX,\x01",4);
        set_num_733(puVar6 + 5,mVar2);
        piVar19 = local_b0;
        uVar3 = archive_entry_nlink(local_b0->entry);
        set_num_733(puVar6 + 0xd,uVar3);
        set_num_733(puVar6 + 0x15,(uint32_t)lVar7);
        set_num_733(puVar6 + 0x1d,(uint32_t)lVar8);
        if ((local_58->field_0xe8 & 2) == 0) {
          if (piVar19->hardlink_target == (isofile *)0x0) {
            pcVar9 = piVar19->cur_content;
          }
          else {
            pcVar9 = piVar19->hardlink_target->cur_content;
          }
          puVar10 = &pcVar9->location;
        }
        else {
          puVar10 = &local_58->dir_location;
        }
        set_num_733(puVar6 + 0x25,*puVar10);
        puVar6 = puVar6 + 0x2c;
      }
      extra_tell_used_size(&ctl,0x2c);
    }
    if ((bVar22 & 4) != 0) {
      if (ctl.limit - ctl.cur_len < 7) {
        puVar6 = extra_next_record(&ctl,7);
      }
      pbVar20 = (byte *)(piVar19->symlink).s;
      if (puVar6 != (uchar *)0x0) {
        puVar6[1] = 'S';
        puVar6[2] = 'L';
        puVar6[4] = '\x01';
      }
      bVar27 = 0;
LAB_0036d807:
      iVar18 = ctl.limit - ctl.cur_len;
      if (0xfe < iVar18) {
        iVar18 = 0xff;
      }
      pbVar16 = puVar6 + 6;
      if (puVar6 == (uchar *)0x0) {
        pbVar16 = (byte *)0x0;
      }
      local_b1 = 0;
      pbVar15 = (byte *)0x0;
      pbVar24 = (byte *)0x0;
      iVar23 = 0;
      while ((piVar19 = local_b0, bVar25 = *pbVar20, bVar25 != 0 && (iVar23 + 0xb < iVar18))) {
        if (bVar25 == 0x2f && bVar27 == 0) {
          if (pbVar16 == (byte *)0x0) {
            pbVar24 = (byte *)0x0;
          }
          else {
            pbVar16[0] = 8;
            pbVar16[1] = 0;
            pbVar24 = pbVar16 + 2;
            pbVar15 = pbVar16;
          }
          pbVar20 = pbVar20 + 1;
          bVar27 = 0x2f;
          pbVar16 = pbVar24;
LAB_0036d9d1:
          iVar23 = iVar23 + 2;
          pbVar24 = (byte *)0x0;
        }
        else {
          if (((bVar27 != 0x2f) && (bVar27 != 0)) || (bVar25 != 0x2e)) {
            if ((bVar25 != 0x2f) ||
               (((pbVar20[1] != 0x2e || (pbVar20[2] != 0x2e)) ||
                ((pbVar20[3] != 0x2f && (pbVar20[3] != 0)))))) goto LAB_0036d8d6;
LAB_0036d8b9:
            if (pbVar16 == (byte *)0x0) {
              pbVar24 = (byte *)0x0;
            }
            else {
              pbVar16[0] = 4;
              pbVar16[1] = 0;
              pbVar24 = pbVar16 + 2;
              bVar25 = *pbVar20;
              pbVar15 = pbVar16;
            }
            lVar14 = (ulong)(bVar25 == 0x2f) + 2;
LAB_0036d9ce:
            pbVar20 = pbVar20 + lVar14;
            bVar27 = 0x2e;
            pbVar16 = pbVar24;
            goto LAB_0036d9d1;
          }
          if ((pbVar20[1] == 0x2e) && ((pbVar20[2] == 0 || (pbVar20[2] == 0x2f))))
          goto LAB_0036d8b9;
LAB_0036d8d6:
          if (((bVar27 == 0x2f) || (bVar27 == 0)) && (bVar25 == 0x2e)) {
            if ((pbVar20[1] == 0) || (pbVar20[1] == 0x2f)) {
LAB_0036d912:
              if (pbVar16 == (byte *)0x0) {
                pbVar24 = (byte *)0x0;
              }
              else {
                pbVar16[0] = 2;
                pbVar16[1] = 0;
                pbVar24 = pbVar16 + 2;
                bVar25 = *pbVar20;
                pbVar15 = pbVar16;
              }
              lVar14 = (ulong)(bVar25 == 0x2f) + 1;
              goto LAB_0036d9ce;
            }
LAB_0036d93c:
            if ((bVar25 == 0x2f) || (pbVar24 == (byte *)0x0)) goto LAB_0036d94c;
LAB_0036d988:
            if (pbVar16 == (byte *)0x0) {
              pbVar16 = (byte *)0x0;
            }
            else {
              *pbVar16 = bVar25;
              pbVar16 = pbVar16 + 1;
              *pbVar24 = *pbVar24 + 1;
            }
            pbVar20 = pbVar20 + 1;
            iVar23 = iVar23 + 1;
            bVar27 = bVar25;
          }
          else {
            if (bVar25 != 0x2f) goto LAB_0036d93c;
            if ((pbVar20[1] == 0x2e) && ((pbVar20[2] == 0x2f || (pbVar20[2] == 0))))
            goto LAB_0036d912;
LAB_0036d94c:
            if (pbVar16 == (byte *)0x0) {
              pbVar16 = (byte *)0x0;
              pbVar24 = &local_b1;
            }
            else {
              pbVar16[0] = 0;
              pbVar16[1] = 0;
              bVar25 = *pbVar20;
              pbVar15 = pbVar16;
              pbVar24 = pbVar16 + 1;
              pbVar16 = pbVar16 + 2;
            }
            iVar23 = iVar23 + 2;
            if (bVar25 != 0x2f) goto LAB_0036d988;
            pbVar20 = pbVar20 + 1;
            bVar27 = 0x2f;
          }
        }
      }
      iVar23 = iVar23 + 5;
      if (bVar25 != 0) {
        if (puVar6 == (uchar *)0x0) {
          puVar6 = (uchar *)0x0;
        }
        else {
          *pbVar15 = *pbVar15 | 1;
          puVar6[3] = (uchar)iVar23;
          puVar6[5] = '\x01';
          puVar6 = puVar6 + iVar23;
        }
        extra_tell_used_size(&ctl,iVar23);
        if (ctl.limit - ctl.cur_len < 0xb) {
          puVar6 = extra_next_record(&ctl,0xb);
        }
        if (puVar6 != (uchar *)0x0) {
          puVar6[1] = 'S';
          puVar6[2] = 'L';
          puVar6[4] = '\x01';
        }
        goto LAB_0036d807;
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        puVar6[3] = (uchar)iVar23;
        puVar6[5] = '\0';
        puVar6 = puVar6 + iVar23;
      }
      extra_tell_used_size(&ctl,iVar23);
    }
    wVar4 = archive_entry_birthtime_is_set(piVar19->entry);
    if (wVar4 == L'\0') {
      bVar17 = false;
      iVar18 = 5;
    }
    else {
      tVar5 = archive_entry_birthtime(piVar19->entry);
      tVar11 = archive_entry_mtime(piVar19->entry);
      bVar17 = tVar5 <= tVar11;
      iVar18 = 5;
      if (tVar5 <= tVar11) {
        iVar18 = 0xc;
      }
    }
    wVar4 = archive_entry_mtime_is_set(piVar19->entry);
    iVar23 = iVar18 + 7;
    bVar27 = bVar17 + 2;
    if (wVar4 == L'\0') {
      iVar23 = iVar18;
      bVar27 = bVar17;
    }
    wVar4 = archive_entry_atime_is_set(piVar19->entry);
    bVar25 = bVar27 + 4;
    iVar18 = iVar23 + 7;
    if (wVar4 == L'\0') {
      bVar25 = bVar27;
      iVar18 = iVar23;
    }
    wVar4 = archive_entry_ctime_is_set(piVar19->entry);
    bVar27 = bVar25 | 8;
    iVar23 = iVar18 + 7;
    if (wVar4 == L'\0') {
      bVar27 = bVar25;
      iVar23 = iVar18;
    }
    if (ctl.limit - ctl.cur_len < iVar23) {
      puVar6 = extra_next_record(&ctl,iVar23);
    }
    piVar19 = local_b0;
    if (puVar6 == (uchar *)0x0) {
      puVar6 = (uchar *)0x0;
    }
    else {
      puVar6[1] = 'T';
      puVar6[2] = 'F';
      puVar6[3] = (uchar)iVar23;
      puVar6[4] = '\x01';
      puVar6[5] = bVar27;
      if ((bVar27 & 1) == 0) {
        puVar6 = puVar6 + 5;
      }
      else {
        tVar5 = archive_entry_birthtime(local_b0->entry);
        set_time_915(puVar6 + 6,tVar5);
        puVar6 = puVar6 + 0xc;
      }
      if ((bVar27 & 2) != 0) {
        tVar5 = archive_entry_mtime(piVar19->entry);
        set_time_915(puVar6 + 1,tVar5);
        puVar6 = puVar6 + 7;
      }
      if ((bVar27 & 4) != 0) {
        tVar5 = archive_entry_atime(piVar19->entry);
        set_time_915(puVar6 + 1,tVar5);
        puVar6 = puVar6 + 7;
      }
      if ((bVar27 & 8) != 0) {
        tVar5 = archive_entry_ctime(piVar19->entry);
        set_time_915(puVar6 + 1,tVar5);
        puVar6 = puVar6 + 7;
      }
    }
    extra_tell_used_size(&ctl,iVar23);
    if ((bVar22 & 0x40) != 0) {
      if (ctl.limit - ctl.cur_len < 4) {
        puVar6 = extra_next_record(&ctl,4);
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        builtin_memcpy(puVar6 + 1,"RE\x04\x01",4);
        puVar6 = puVar6 + 4;
      }
      extra_tell_used_size(&ctl,4);
    }
    if ((bVar22 & 0x20) != 0) {
      if (ctl.limit - ctl.cur_len < 0xc) {
        puVar6 = extra_next_record(&ctl,0xc);
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        builtin_memcpy(puVar6 + 1,"PL\f\x01",4);
        set_num_733(puVar6 + 5,local_50->dir_location);
        puVar6 = puVar6 + 0xc;
      }
      extra_tell_used_size(&ctl,0xc);
    }
    if ((bVar22 & 0x10) != 0) {
      if (ctl.limit - ctl.cur_len < 0xc) {
        puVar6 = extra_next_record(&ctl,0xc);
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        builtin_memcpy(puVar6 + 1,"CL\f\x01",4);
        set_num_733(puVar6 + 5,local_68->rr_child->dir_location);
        puVar6 = puVar6 + 0xc;
      }
      extra_tell_used_size(&ctl,0xc);
    }
    if ((bVar22 & 2) != 0) {
      if (ctl.limit - ctl.cur_len < 0x14) {
        puVar6 = extra_next_record(&ctl,0x14);
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        builtin_memcpy(puVar6 + 1,"PN\x14\x01",4);
        dVar12 = archive_entry_rdev(piVar19->entry);
        set_num_733(puVar6 + 5,(uint32_t)(dVar12 >> 0x20));
        set_num_733(puVar6 + 0xd,(uint32_t)dVar12);
        puVar6 = puVar6 + 0x14;
      }
      extra_tell_used_size(&ctl,0x14);
    }
    if ((piVar19->zisofs).header_size != '\0') {
      if (ctl.limit - ctl.cur_len < 0x10) {
        puVar6 = extra_next_record(&ctl,0x10);
      }
      if (puVar6 == (uchar *)0x0) {
        puVar6 = (uchar *)0x0;
      }
      else {
        puVar6[1] = 'Z';
        puVar6[2] = 'F';
        puVar6[3] = '\x10';
        puVar6[4] = '\x01';
        puVar6[5] = 'p';
        puVar6[6] = 'z';
        puVar6[7] = (piVar19->zisofs).header_size;
        puVar6[8] = (piVar19->zisofs).log2_bs;
        set_num_733(puVar6 + 9,(piVar19->zisofs).uncompressed_size);
        puVar6 = puVar6 + 0x10;
      }
      extra_tell_used_size(&ctl,0x10);
    }
    if ((bVar1) && (local_68 == local_68->parent)) {
      if (puVar6 != (uchar *)0x0) {
        set_SUSP_CE(puVar6 + 1,iso9660->location_rrip_er,0,0xed);
      }
      extra_tell_used_size(&ctl,0x1c);
    }
    extra_close_record(&ctl,0);
    uVar30 = (ulong)(uint)ctl.dr_len;
    isoent = local_a8;
  }
  iVar18 = (int)uVar30;
  if (p == (uchar *)0x0) {
    if (t == DIR_REC_NORMAL) {
      (isoent->dr_len).normal = iVar18;
      return iVar18;
    }
    if (t == DIR_REC_PARENT) {
      (isoent->dr_len).parent = iVar18;
      return iVar18;
    }
    (isoent->dr_len).self = iVar18;
    return iVar18;
  }
LAB_0036de4a:
  *p = (uchar)uVar30;
  return (int)uVar30;
}

Assistant:

static int
set_directory_record(unsigned char *p, size_t n, struct isoent *isoent,
    struct iso9660 *iso9660, enum dir_rec_type t,
    enum vdd_type vdd_type)
{
	unsigned char *bp;
	size_t dr_len;
	size_t fi_len;

	if (p != NULL) {
		/*
		 * Check whether a write buffer size is less than the
		 * saved size which is needed to write this Directory
		 * Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			dr_len = isoent->dr_len.vd; break;
		case DIR_REC_SELF:
			dr_len = isoent->dr_len.self; break;
		case DIR_REC_PARENT:
			dr_len = isoent->dr_len.parent; break;
		case DIR_REC_NORMAL:
		default:
			dr_len = isoent->dr_len.normal; break;
		}
		if (dr_len > n)
			return (0);/* Needs more buffer size. */
	}

	if (t == DIR_REC_NORMAL && isoent->identifier != NULL)
		fi_len = isoent->id_len;
	else
		fi_len = 1;

	if (p != NULL) {
		struct isoent *xisoent;
		struct isofile *file;
		unsigned char flag;

		if (t == DIR_REC_PARENT)
			xisoent = isoent->parent;
		else
			xisoent = isoent;
		file = isoent->file;
		if (file->hardlink_target != NULL)
			file = file->hardlink_target;
		/* Make a file flag. */
		if (xisoent->dir)
			flag = FILE_FLAG_DIRECTORY;
		else {
			if (file->cur_content->next != NULL)
				flag = FILE_FLAG_MULTI_EXTENT;
			else
				flag = 0;
		}

		bp = p -1;
		/* Extended Attribute Record Length */
		set_num_711(bp+2, 0);
		/* Location of Extent */
		if (xisoent->dir)
			set_num_733(bp+3, xisoent->dir_location);
		else
			set_num_733(bp+3, file->cur_content->location);
		/* Data Length */
		if (xisoent->dir)
			set_num_733(bp+11,
			    xisoent->dir_block * LOGICAL_BLOCK_SIZE);
		else
			set_num_733(bp+11, (uint32_t)file->cur_content->size);
		/* Recording Date and Time */
		/* NOTE:
		 *  If a file type is symbolic link, you are seeing this
		 *  field value is different from a value mkisofs makes.
		 *  libarchive uses lstat to get this one, but it
		 *  seems mkisofs uses stat to get.
		 */
		set_time_915(bp+19,
		    archive_entry_mtime(xisoent->file->entry));
		/* File Flags */
		bp[26] = flag;
		/* File Unit Size */
		set_num_711(bp+27, 0);
		/* Interleave Gap Size */
		set_num_711(bp+28, 0);
		/* Volume Sequence Number */
		set_num_723(bp+29, iso9660->volume_sequence_number);
		/* Length of File Identifier */
		set_num_711(bp+33, (unsigned char)fi_len);
		/* File Identifier */
		switch (t) {
		case DIR_REC_VD:
		case DIR_REC_SELF:
			set_num_711(bp+34, 0);
			break;
		case DIR_REC_PARENT:
			set_num_711(bp+34, 1);
			break;
		case DIR_REC_NORMAL:
			if (isoent->identifier != NULL)
				memcpy(bp+34, isoent->identifier, fi_len);
			else
				set_num_711(bp+34, 0);
			break;
		}
	} else
		bp = NULL;
	dr_len = 33 + fi_len;
	/* Padding Field */
	if (dr_len & 0x01) {
		dr_len ++;
		if (p != NULL)
			bp[dr_len] = 0;
	}

	/* Volume Descriptor does not record extension. */
	if (t == DIR_REC_VD) {
		if (p != NULL)
			/* Length of Directory Record */
			set_num_711(p, (unsigned char)dr_len);
		else
			isoent->dr_len.vd = (int)dr_len;
		return ((int)dr_len);
	}

	/* Rockridge */
	if (iso9660->opt.rr && vdd_type != VDD_JOLIET)
		dr_len = set_directory_record_rr(bp, (int)dr_len,
		    isoent, iso9660, t);

	if (p != NULL)
		/* Length of Directory Record */
		set_num_711(p, (unsigned char)dr_len);
	else {
		/*
		 * Save the size which is needed to write this
		 * Directory Record.
		 */
		switch (t) {
		case DIR_REC_VD:
			/* This case does not come, but compiler
			 * complains that DIR_REC_VD not handled
			 *  in switch ....  */
			break;
		case DIR_REC_SELF:
			isoent->dr_len.self = (int)dr_len; break;
		case DIR_REC_PARENT:
			isoent->dr_len.parent = (int)dr_len; break;
		case DIR_REC_NORMAL:
			isoent->dr_len.normal = (int)dr_len; break;
		}
	}

	return ((int)dr_len);
}